

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandWriteCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  Abc_Cex_t *pAVar1;
  bool bVar2;
  int iVar3;
  uint fAiger;
  uint fUseOldMin;
  uint fVerbose;
  uint fMinimize;
  uint fCheckCex;
  uint fHighEffort;
  uint fUseSatBased;
  FILE *pFVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  size_t __size;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint fNames;
  uint local_80;
  uint local_7c;
  
  fUseSatBased = 0;
  Extra_UtilGetoptReset();
  fHighEffort = 0;
  fUseOldMin = 0;
  fCheckCex = 0;
  bVar2 = false;
  fAiger = 0;
  local_80 = 0;
  local_7c = 0;
  fVerbose = 0;
  fMinimize = 0;
  fNames = 0;
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"snmueocafzvh");
    switch(iVar3) {
    case 0x61:
      fAiger = fAiger ^ 1;
      break;
    case 99:
      fCheckCex = fCheckCex ^ 1;
      break;
    case 0x65:
      fHighEffort = fHighEffort ^ 1;
      break;
    case 0x66:
      local_80 = local_80 ^ 1;
      break;
    case 0x6d:
      fMinimize = fMinimize ^ 1;
      break;
    case 0x6e:
      fNames = fNames ^ 1;
      break;
    case 0x6f:
      fUseOldMin = fUseOldMin ^ 1;
      break;
    case 0x73:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x75:
      fUseSatBased = fUseSatBased ^ 1;
      break;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x7a:
      local_7c = local_7c ^ 1;
      break;
    default:
      if (iVar3 == -1) {
        pNtk = pAbc->pNtkCur;
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pFVar4 = (FILE *)pAbc->Out;
          pcVar9 = "Empty network.\n";
          __size = 0xf;
LAB_00326443:
          fwrite(pcVar9,__size,1,pFVar4);
          return 0;
        }
        if (((pNtk->pModel == (int *)0x0) && (pAbc->pCex == (Abc_Cex_t *)0x0)) &&
           (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
          pFVar4 = (FILE *)pAbc->Out;
          pcVar9 = "Counter-example is not available.\n";
          __size = 0x22;
          goto LAB_00326443;
        }
        if (globalUtilOptind + 1 == argc) {
          pcVar9 = argv[globalUtilOptind];
          pAVar1 = pAbc->pCex;
          if ((pAVar1 == (Abc_Cex_t *)0x0) && (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
            pFVar4 = fopen(pcVar9,"w");
            if (pFVar4 == (FILE *)0x0) {
LAB_003267c3:
              fprintf(_stdout,"IoCommandWriteCex(): Cannot open the output file \"%s\".\n",pcVar9);
              goto LAB_003267de;
            }
            if (fNames == 0) {
              if (0 < pNtk->vPis->nSize) {
                lVar7 = 0;
                do {
                  fputc(pNtk->pModel[lVar7] == 1 | 0x30,pFVar4);
                  lVar7 = lVar7 + 1;
                } while (lVar7 < pNtk->vPis->nSize);
              }
            }
            else {
              pcVar9 = "@0";
              if (!bVar2) {
                pcVar9 = "";
              }
              pVVar5 = pNtk->vPis;
              if (0 < pVVar5->nSize) {
                lVar7 = 0;
                do {
                  pcVar6 = Abc_ObjName((Abc_Obj_t *)pVVar5->pArray[lVar7]);
                  fprintf(pFVar4,"%s%s=%c\n",pcVar6,pcVar9,(ulong)(pNtk->pModel[lVar7] == 1 | 0x30))
                  ;
                  lVar7 = lVar7 + 1;
                  pVVar5 = pNtk->vPis;
                } while (lVar7 < pVVar5->nSize);
              }
            }
            fputc(10,pFVar4);
          }
          else {
            pFVar4 = fopen(pcVar9,"w");
            if (pFVar4 == (FILE *)0x0) goto LAB_003267c3;
            if (pAbc->pCex == (Abc_Cex_t *)0x0) {
              if ((pAbc->vCexVec != (Vec_Ptr_t *)0x0) && (pVVar5 = pAbc->vCexVec, 0 < pVVar5->nSize)
                 ) {
                uVar8 = 0;
                do {
                  pAVar1 = (Abc_Cex_t *)pVVar5->pArray[uVar8];
                  if (pAVar1 != (Abc_Cex_t *)0x0) {
                    fprintf(pFVar4,"#\n#\n# CEX for output %d\n#\n",uVar8 & 0xffffffff);
                    Abc_NtkDumpOneCex((FILE *)pFVar4,pNtk,pAVar1,local_80,fNames,local_7c,fMinimize,
                                      fUseOldMin,fCheckCex,fUseSatBased,fHighEffort,fAiger,fVerbose)
                    ;
                  }
                  uVar8 = uVar8 + 1;
                  pVVar5 = pAbc->vCexVec;
                } while ((long)uVar8 < (long)pVVar5->nSize);
              }
            }
            else {
              Abc_NtkDumpOneCex((FILE *)pFVar4,pNtk,pAVar1,local_80,fNames,local_7c,fMinimize,
                                fUseOldMin,fCheckCex,fUseSatBased,fHighEffort,fAiger,fVerbose);
            }
            fwrite("# DONE\n",7,1,pFVar4);
          }
          fclose(pFVar4);
LAB_003267de:
          if (pFVar4 != (FILE *)0x0) {
            return 0;
          }
          return 1;
        }
        puts("File name is missing on the command line.");
      }
    case 0x62:
    case 100:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x77:
    case 0x78:
    case 0x79:
      fwrite("usage: write_cex [-snmueocfzvh] <file>\n",0x27,1,(FILE *)pAbc->Err);
      fwrite("\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n"
             ,0x50,1,(FILE *)pAbc->Err);
      fwrite("\t         the output file <file> contains values for each PI in natural order\n",0x4e
             ,1,(FILE *)pAbc->Err);
      pcVar6 = "yes";
      pcVar9 = "yes";
      if (!bVar2) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n",pcVar9
             );
      pcVar9 = "yes";
      if (fNames == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-n     : write input names into the file [default = %s]\n",pcVar9
             );
      pcVar9 = "yes";
      if (fMinimize == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-m     : minimize CEX by dropping don\'t-care values [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (fUseSatBased == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-u     : use fast SAT-based CEX minimization [default = %s]\n",
              pcVar9);
      pcVar9 = "yes";
      if (fHighEffort == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (fUseOldMin == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-o     : use old CEX minimization algorithm [default = %s]\n",
              pcVar9);
      pcVar9 = "yes";
      if (fCheckCex == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-c     : check generated CEX using ternary simulation [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (fAiger == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-a     : print cex in AIGER 1.9 format [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (local_80 == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-f     : enable printing flop values in each timeframe [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (local_7c == 0) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-z     : toggle using saved flop names [default = %s]\n",pcVar9);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v     : enable verbose output [default = %s]\n",pcVar6);
      fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
      fwrite("\t<file> : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
      return 1;
    }
  } while( true );
}

Assistant:

int IoCommandWriteCex( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fNames  = 0;
    int fMinimize  = 0;
    int fUseSatBased = 0;
    int fHighEffort = 0;
    int fUseOldMin = 0;
    int fCheckCex  = 0;
    int forceSeq   = 0;
    int fAiger     = 0;
    int fPrintFull = 0;
    int fUseFfNames = 0;
    int fVerbose   = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "snmueocafzvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 's':
                forceSeq ^= 1;
                break;
            case 'n':
                fNames ^= 1;
                break;
            case 'm':
                fMinimize ^= 1;
                break;
            case 'u':
                fUseSatBased ^= 1;
                break;
            case 'e':
                fHighEffort ^= 1;
                break;
            case 'o':
                fUseOldMin ^= 1;
                break;
            case 'c':
                fCheckCex ^= 1;
                break;
            case 'a':
                fAiger ^= 1;
                break;
            case 'f':
                fPrintFull ^= 1;
                break;
            case 'z':
                fUseFfNames ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    pNtk = pAbc->pNtkCur;
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( pNtk->pModel == NULL && pAbc->pCex == NULL && pAbc->vCexVec == NULL )
    {
        fprintf( pAbc->Out, "Counter-example is not available.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "File name is missing on the command line.\n" );
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    // write the counter-example into the file
    if ( pAbc->pCex || pAbc->vCexVec )
    { 
        Abc_Cex_t * pCex = pAbc->pCex;
        FILE * pFile; int i;
        /*
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( !Abc_LatchIsInit0(pObj) )
            {
                fprintf( stdout, "IoCommandWriteCex(): The init-state should be all-0 for counter-example to work.\n" );
                fprintf( stdout, "Run commands \"undc\" and \"zero\" and then rerun the equivalence check.\n" );
                return 1;
            }
        */
        pFile = fopen( pFileName, "w" );
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( pAbc->pCex )
        {
            Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
        }
        else if ( pAbc->vCexVec )
        {
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pCex, i )
            {
                if ( pCex == NULL )
                    continue;
                fprintf( pFile, "#\n#\n# CEX for output %d\n#\n", i ); 
                Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                    fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                    fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
            }
        }
        fprintf( pFile, "# DONE\n" ); 
        fclose( pFile );
    }
    else
    {
        Abc_Obj_t * pObj;
        FILE * pFile = fopen( pFileName, "w" );
        int i;
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( fNames )
        {
            const char *cycle_ctr = forceSeq?"@0":"";
            Abc_NtkForEachPi( pNtk, pObj, i )
//                fprintf( pFile, "%s=%c\n", Abc_ObjName(pObj), '0'+(pNtk->pModel[i]==1) );
                fprintf( pFile, "%s%s=%c\n", Abc_ObjName(pObj), cycle_ctr, '0'+(pNtk->pModel[i]==1) );
        }
        else
        {
            Abc_NtkForEachPi( pNtk, pObj, i )
                fprintf( pFile, "%c", '0'+(pNtk->pModel[i]==1) );
        }
        fprintf( pFile, "\n" );
        fclose( pFile );
    }

    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cex [-snmueocfzvh] <file>\n" );
    fprintf( pAbc->Err, "\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n" );
    fprintf( pAbc->Err, "\t         the output file <file> contains values for each PI in natural order\n" );
    fprintf( pAbc->Err, "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n", forceSeq? "yes": "no" );
    fprintf( pAbc->Err, "\t-n     : write input names into the file [default = %s]\n", fNames? "yes": "no" );
    fprintf( pAbc->Err, "\t-m     : minimize CEX by dropping don't-care values [default = %s]\n", fMinimize? "yes": "no" );
    fprintf( pAbc->Err, "\t-u     : use fast SAT-based CEX minimization [default = %s]\n", fUseSatBased? "yes": "no" );
    fprintf( pAbc->Err, "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n", fHighEffort? "yes": "no" );
    fprintf( pAbc->Err, "\t-o     : use old CEX minimization algorithm [default = %s]\n", fUseOldMin? "yes": "no" );
    fprintf( pAbc->Err, "\t-c     : check generated CEX using ternary simulation [default = %s]\n", fCheckCex? "yes": "no" );
    fprintf( pAbc->Err, "\t-a     : print cex in AIGER 1.9 format [default = %s]\n", fAiger? "yes": "no" );
    fprintf( pAbc->Err, "\t-f     : enable printing flop values in each timeframe [default = %s]\n", fPrintFull? "yes": "no" );  
    fprintf( pAbc->Err, "\t-z     : toggle using saved flop names [default = %s]\n", fUseFfNames? "yes": "no" );  
    fprintf( pAbc->Err, "\t-v     : enable verbose output [default = %s]\n", fVerbose? "yes": "no" );  
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\t<file> : the name of the file to write\n" );
    return 1;
}